

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
::resize(raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
         *this,size_t new_capacity)

{
  ctrl_t *p;
  slot_type *m;
  bool bVar1;
  ctrl_t h;
  pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int> *ts;
  size_t hashval_00;
  allocator_type *paVar2;
  size_t sVar3;
  FindInfo FVar4;
  undefined1 local_70 [8];
  Layout layout;
  size_t new_i;
  FindInfo target;
  size_t hashval;
  size_t i;
  size_t old_capacity;
  slot_type *old_slots;
  ctrl_t *old_ctrl;
  size_t new_capacity_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
  *this_local;
  
  bVar1 = IsValidCapacity(new_capacity);
  if (bVar1) {
    p = this->ctrl_;
    m = this->slots_;
    sVar3 = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    for (hashval = 0; hashval != sVar3; hashval = hashval + 1) {
      bVar1 = IsFull(p[hashval]);
      if (bVar1) {
        target.probe_length = (size_t)hash_ref(this);
        ts = hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,void>
             ::
             element<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>>
                       (m + hashval);
        hashval_00 = hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,void>
                     ::
                     apply<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,phmap::priv::(anonymous_namespace)::NonMovableKeyHash,phmap::priv::(anonymous_namespace)::NonMovableKeyEq,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>::HashElement,std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>&,phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>>
                               ((HashElement *)&target.probe_length,ts);
        FVar4 = find_first_non_full(this,hashval_00);
        new_i = FVar4.offset;
        layout.
        super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_*>
        .size_[1] = new_i;
        h = H2(hashval_00);
        set_ctrl(this,new_i,h);
        paVar2 = alloc_ref(this);
        hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,int>,void>
        ::
        transfer<std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>
                  (paVar2,this->slots_ +
                          layout.
                          super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_*>
                          .size_[1],m + hashval);
      }
    }
    if (sVar3 != 0) {
      SanitizerUnpoisonMemoryRegion(m,sVar3 << 3);
      _local_70 = (size_t  [2])MakeLayout(sVar3);
      paVar2 = alloc_ref(this);
      sVar3 = internal_layout::
              LayoutImpl<std::tuple<signed_char,_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_*>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
              ::AllocSize((LayoutImpl<std::tuple<signed_char,_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_*>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                           *)local_70);
      Deallocate<8ul,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>>
                (paVar2,p,sVar3);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, phmap::priv::(anonymous namespace)::NonMovableKeyHash, phmap::priv::(anonymous namespace)::NonMovableKeyEq, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>>::resize(size_t) [Policy = phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, Hash = phmap::priv::(anonymous namespace)::NonMovableKeyHash, Eq = phmap::priv::(anonymous namespace)::NonMovableKeyEq, Alloc = std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>]"
               );
}

Assistant:

void resize(size_t new_capacity) {
        assert(IsValidCapacity(new_capacity));
        auto* old_ctrl = ctrl_;
        auto* old_slots = slots_;
        const size_t old_capacity = capacity_;
        initialize_slots(new_capacity);
        capacity_ = new_capacity;

        for (size_t i = 0; i != old_capacity; ++i) {
            if (IsFull(old_ctrl[i])) {
                size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                     PolicyTraits::element(old_slots + i));
                auto target = find_first_non_full(hashval);
                size_t new_i = target.offset;
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, old_slots + i);
            }
        }
        if (old_capacity) {
            SanitizerUnpoisonMemoryRegion(old_slots,
                                          sizeof(slot_type) * old_capacity);
            auto layout = MakeLayout(old_capacity);
            Deallocate<Layout::Alignment()>(&alloc_ref(), old_ctrl,
                                            layout.AllocSize());
        }
    }